

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O0

void ConvertARGBToY_C(uint32_t *argb,uint8_t *y,int width)

{
  uint uVar1;
  int iVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint32_t p;
  int i;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    uVar1 = *(uint *)(in_RDI + (long)local_18 * 4);
    iVar2 = VP8RGBToY(uVar1 >> 0x10 & 0xff,uVar1 >> 8 & 0xff,uVar1 & 0xff,0x8000);
    *(char *)(in_RSI + local_18) = (char)iVar2;
  }
  return;
}

Assistant:

static void ConvertARGBToY_C(const uint32_t* argb, uint8_t* y, int width) {
  int i;
  for (i = 0; i < width; ++i) {
    const uint32_t p = argb[i];
    y[i] = VP8RGBToY((p >> 16) & 0xff, (p >> 8) & 0xff, (p >>  0) & 0xff,
                     YUV_HALF);
  }
}